

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

bool __thiscall CSocekt::flyd_open_listening_sockets(CSocekt *this)

{
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  Logger *pLVar4;
  size_type sVar5;
  LogStream *str;
  long in_RDI;
  lp_listening_t p_listensocketitem;
  int reuseaddr;
  int i;
  char strinfo [100];
  int iport;
  sockaddr_in serv_addr;
  int isock;
  LogLevel in_stack_ffffffffffff7f38;
  int in_stack_ffffffffffff7f3c;
  Logger *in_stack_ffffffffffff7f40;
  Config *in_stack_ffffffffffff7f48;
  SourceFile *in_stack_ffffffffffff7f50;
  self *in_stack_ffffffffffff7f58;
  Logger *in_stack_ffffffffffff7f60;
  LogStream *in_stack_ffffffffffff7f68;
  Logger *in_stack_ffffffffffff7f70;
  Logger local_7fe8;
  Logger local_7000;
  int *local_6028;
  Logger local_6010;
  Logger local_5028;
  Logger local_4040;
  Logger local_3058;
  Logger local_2070;
  undefined4 local_1098 [8];
  Logger local_1078;
  uint local_9c;
  char local_98 [112];
  int local_28;
  sockaddr local_24;
  int local_14;
  
  memset(&local_24,0,0x10);
  local_24.sa_family = 2;
  local_24.sa_data._2_4_ = htonl(0);
  local_9c = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x70) <= (int)local_9c) {
      sVar5 = std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::size
                        ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)
                         (in_RDI + 0x130));
      if (sVar5 == 0) {
        muduo::Logger::SourceFile::SourceFile<100>
                  (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
        pLVar4 = &local_7fe8;
        file_05._8_8_ = in_stack_ffffffffffff7f50;
        file_05.data_ = (char *)in_stack_ffffffffffff7f48;
        muduo::Logger::Logger(pLVar4,file_05,in_stack_ffffffffffff7f3c,in_stack_ffffffffffff7f38);
        str = muduo::Logger::stream(pLVar4);
        muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff7f50,(char *)str);
        muduo::Logger::~Logger(in_stack_ffffffffffff7f70);
      }
      return sVar5 != 0;
    }
    local_14 = socket(2,1,0);
    if (local_14 == -1) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
      file._8_8_ = in_stack_ffffffffffff7f50;
      file.data_ = (char *)in_stack_ffffffffffff7f48;
      muduo::Logger::Logger
                (in_stack_ffffffffffff7f40,file,in_stack_ffffffffffff7f3c,in_stack_ffffffffffff7f38)
      ;
      muduo::Logger::stream(&local_1078);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f3c)
      ;
      muduo::Logger::~Logger(in_stack_ffffffffffff7f70);
      return false;
    }
    local_1098[0] = 1;
    iVar2 = setsockopt(local_14,1,2,local_1098,4);
    if (iVar2 == -1) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
      file_00._8_8_ = in_stack_ffffffffffff7f50;
      file_00.data_ = (char *)in_stack_ffffffffffff7f48;
      muduo::Logger::Logger
                (in_stack_ffffffffffff7f40,file_00,in_stack_ffffffffffff7f3c,
                 in_stack_ffffffffffff7f38);
      muduo::Logger::stream(&local_2070);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f3c)
      ;
      muduo::Logger::~Logger(in_stack_ffffffffffff7f70);
      close(local_14);
      return false;
    }
    bVar1 = setnonblocking((CSocekt *)CONCAT44(in_stack_ffffffffffff7f3c,in_stack_ffffffffffff7f38),
                           0);
    if (!bVar1) break;
    local_98[0] = '\0';
    sprintf(local_98,"ListenPort%d",(ulong)local_9c);
    flyd::Singleton<flyd::Config>::getInstance();
    local_28 = flyd::Config::GetIntDefault
                         (in_stack_ffffffffffff7f48,(char *)in_stack_ffffffffffff7f40,
                          in_stack_ffffffffffff7f3c);
    LVar3 = muduo::Logger::logLevel();
    if ((int)LVar3 < 2) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
      file_06._8_8_ = in_stack_ffffffffffff7f70;
      file_06.data_ = (char *)in_stack_ffffffffffff7f68;
      muduo::Logger::Logger
                (in_stack_ffffffffffff7f60,file_06,(int)((ulong)in_stack_ffffffffffff7f58 >> 0x20),
                 (LogLevel)in_stack_ffffffffffff7f58,(char *)in_stack_ffffffffffff7f50);
      muduo::Logger::stream(&local_4040);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f3c)
      ;
      muduo::Logger::~Logger(in_stack_ffffffffffff7f70);
    }
    local_24.sa_data._0_2_ = htons((uint16_t)local_28);
    iVar2 = bind(local_14,&local_24,0x10);
    if (iVar2 == -1) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
      file_02._8_8_ = in_stack_ffffffffffff7f50;
      file_02.data_ = (char *)in_stack_ffffffffffff7f48;
      muduo::Logger::Logger
                (in_stack_ffffffffffff7f40,file_02,in_stack_ffffffffffff7f3c,
                 in_stack_ffffffffffff7f38);
      muduo::Logger::stream(&local_5028);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f3c)
      ;
      muduo::Logger::~Logger(in_stack_ffffffffffff7f70);
      close(local_14);
      return false;
    }
    iVar2 = listen(local_14,0x1ff);
    if (iVar2 == -1) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
      file_03._8_8_ = in_stack_ffffffffffff7f50;
      file_03.data_ = (char *)in_stack_ffffffffffff7f48;
      muduo::Logger::Logger
                (in_stack_ffffffffffff7f40,file_03,in_stack_ffffffffffff7f3c,
                 in_stack_ffffffffffff7f38);
      muduo::Logger::stream(&local_6010);
      pLVar4 = (Logger *)
               muduo::LogStream::operator<<
                         ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f3c)
      ;
      muduo::Logger::~Logger(pLVar4);
      close(local_14);
      return false;
    }
    local_6028 = (int *)operator_new(0x10);
    memset(local_6028,0,0x10);
    *local_6028 = local_28;
    local_6028[1] = local_14;
    LVar3 = muduo::Logger::logLevel();
    if ((int)LVar3 < 3) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
      in_stack_ffffffffffff7f60 = &local_7000;
      file_04._8_8_ = in_stack_ffffffffffff7f50;
      file_04.data_ = (char *)in_stack_ffffffffffff7f48;
      muduo::Logger::Logger(in_stack_ffffffffffff7f40,file_04,in_stack_ffffffffffff7f3c);
      in_stack_ffffffffffff7f68 = muduo::Logger::stream(in_stack_ffffffffffff7f60);
      in_stack_ffffffffffff7f58 =
           muduo::LogStream::operator<<
                     ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
      in_stack_ffffffffffff7f50 =
           (SourceFile *)
           muduo::LogStream::operator<<
                     ((LogStream *)in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f3c);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
      muduo::Logger::~Logger(in_stack_ffffffffffff7f70);
    }
    std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::push_back
              ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)
               in_stack_ffffffffffff7f50,(value_type *)in_stack_ffffffffffff7f48);
    local_9c = local_9c + 1;
  }
  muduo::Logger::SourceFile::SourceFile<100>
            (in_stack_ffffffffffff7f50,(char (*) [100])in_stack_ffffffffffff7f48);
  file_01._8_8_ = in_stack_ffffffffffff7f50;
  file_01.data_ = (char *)in_stack_ffffffffffff7f48;
  muduo::Logger::Logger
            (in_stack_ffffffffffff7f40,file_01,in_stack_ffffffffffff7f3c,in_stack_ffffffffffff7f38);
  muduo::Logger::stream(&local_3058);
  muduo::LogStream::operator<<
            ((LogStream *)in_stack_ffffffffffff7f50,(char *)in_stack_ffffffffffff7f48);
  muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f3c);
  muduo::Logger::~Logger(in_stack_ffffffffffff7f70);
  close(local_14);
  return false;
}

Assistant:

bool CSocekt::flyd_open_listening_sockets()
{
    int                isock;                //socket
    struct sockaddr_in serv_addr;            //服务器的地址结构体
    int                iport;                //端口
    char               strinfo[100];         //临时字符串

    //初始化相关
    memset(&serv_addr,0,sizeof(serv_addr));  //先初始化一下
    serv_addr.sin_family = AF_INET;                //选择协议族为IPV4
    serv_addr.sin_addr.s_addr = htonl(INADDR_ANY); //监听本地所有的IP地址；INADDR_ANY表示的是一个服务器上所有的网卡（服务器可能不止一个网卡）多个本地ip地址都进行绑定端口号，进行侦听。

    //中途用到一些配置信息
  //  CConfig *p_config = CConfig::GetInstance();
    for(int i = 0; i < m_ListenPortCount; i++) //要监听这么多个端口
    {
        //参数1：AF_INET：使用ipv4协议，一般就这么写
        //参数2：SOCK_STREAM：使用TCP，表示可靠连接【相对还有一个UDP套接字，表示不可靠连接】
        //参数3：给0，固定用法，就这么记
        isock = socket(AF_INET,SOCK_STREAM,0); //系统函数，成功返回非负描述符，出错返回-1
        if(isock == -1)
        {
            LOG_ERROR << "CSocekt::Initialize()中socket()失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中socket()失败,i=%d.",i);
            //其实这里直接退出，那如果以往有成功创建的socket呢？就没得到释放吧，当然走到这里表示程序不正常，应该整个退出，也没必要释放了
            return false;
        }

        //setsockopt（）:设置一些套接字参数选项；
        //参数2：是表示级别，和参数3配套使用，也就是说，参数3如果确定了，参数2就确定了;
        //参数3：允许重用本地地址
        //设置 SO_REUSEADDR，目的第五章第三节讲解的非常清楚：主要是解决TIME_WAIT这个状态导致bind()失败的问题
        int reuseaddr = 1;  //1:打开对应的设置项
        if(setsockopt(isock,SOL_SOCKET, SO_REUSEADDR,(const void *) &reuseaddr, sizeof(reuseaddr)) == -1)
        {
            LOG_ERROR << "CSocekt::Initialize()中setsockopt(SO_REUSEADDR)失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中setsockopt(SO_REUSEADDR)失败,i=%d.",i);
            close(isock); //无需理会是否正常执行了
            return false;
        }
        //设置该socket为非阻塞
        if(setnonblocking(isock) == false)
        {
            LOG_ERROR << "CSocekt::Initialize()中setnonblocking()失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中setnonblocking()失败,i=%d.",i);
            close(isock);
            return false;
        }

        //设置本服务器要监听的地址和端口，这样客户端才能连接到该地址和端口并发送数据
        strinfo[0] = 0;
        sprintf(strinfo,"ListenPort%d",i);
        iport = Singleton<Config>::getInstance().GetIntDefault(strinfo, 10000);
        LOG_DEBUG << "iport = " << iport;
       // iport = p_config->GetIntDefault(strinfo,10000);
        serv_addr.sin_port = htons((in_port_t)iport);   //in_port_t其实就是uint16_t

        //绑定服务器地址结构体
        if(bind(isock, (struct sockaddr*)&serv_addr, sizeof(serv_addr)) == -1)
        {
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中bind()失败,i=%d.",i);
            LOG_ERROR << "CSocekt::Initialize()中bind()失败,i= " << i ;
            close(isock);
            return false;
        }

        //开始监听
        if(listen(isock,FLYD_LISTEN_BACKLOG) == -1)
        {
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中listen()失败,i=%d.",i);
            LOG_ERROR << "CSocekt::Initialize()中listen()失败,i= " << i ;
            close(isock);
            return false;
        }

        //可以，放到列表里来
        lp_listening_t p_listensocketitem = new flyd_listening_t; //千万不要写错，注意前边类型是指针，后边类型是一个结构体
        memset(p_listensocketitem,0,sizeof(flyd_listening_t));      //注意后边用的是 ngx_listening_t而不是lpngx_listening_t
        p_listensocketitem->port = iport;                          //记录下所监听的端口号
        p_listensocketitem->fd   = isock;                          //套接字句柄保存下来
     //   ngx_log_error_core(NGX_LOG_INFO,0,"监听%d端口成功!",iport); //显示一些信息到日志中
        LOG_INFO << "监听" << iport << "端口成功!";
        m_ListenSocketList.push_back(p_listensocketitem);          //加入到队列中
    } //end for(int i = 0; i < m_ListenPortCount; i++)
    if(m_ListenSocketList.size() <= 0)  //不可能一个端口都不监听吧
    {
        LOG_ERROR << "一个端口都没有监听";
        return false;
    }
    return true;
}